

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O2

void __thiscall
soul::HTMLGenerator::appendSpansForContent
          (HTMLGenerator *this,HTMLElement *parent,string_view markdown)

{
  function<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_00;
  size_type __n;
  size_type __pos;
  size_type sVar1;
  int iVar2;
  FoundDelimiter *pFVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  long lVar6;
  DelimiterType *type;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  string_view markdown_00;
  string_view markdown_01;
  allocator<char> local_121;
  string_view markdown_local;
  string part2;
  DelimitedSection range;
  ArrayWithPreallocation<FoundDelimiter,_4UL> found;
  
  pcVar4 = markdown._M_str;
  markdown_local._M_str = (char *)markdown._M_len;
  markdown_local._M_len = (size_t)parent;
  if (appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
      ::delimiterTypes == '\0') {
    iVar2 = __cxa_guard_acquire(&appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
                                 ::delimiterTypes);
    if (iVar2 != 0) {
      appendSpansForContent::delimiterTypes[0].findNextMatch.super__Function_base._M_functor =
           (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[0].findNextMatch._M_invoker =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:650:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[0].findNextMatch.super__Function_base._M_manager =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:650:17)>
           ::_M_manager;
      appendSpansForContent::delimiterTypes[0].addReplacementElement.super__Function_base._M_functor
           = (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[0].addReplacementElement._M_invoker =
           std::
           _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:654:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[0].addReplacementElement.super__Function_base._M_manager
           = std::
             _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:654:17)>
             ::_M_manager;
      appendSpansForContent::delimiterTypes[1].findNextMatch.super__Function_base._M_functor =
           (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[1].findNextMatch._M_invoker =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:661:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[1].findNextMatch.super__Function_base._M_manager =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:661:17)>
           ::_M_manager;
      appendSpansForContent::delimiterTypes[1].addReplacementElement.super__Function_base._M_functor
           = (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[1].addReplacementElement._M_invoker =
           std::
           _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:665:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[1].addReplacementElement.super__Function_base._M_manager
           = std::
             _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:665:17)>
             ::_M_manager;
      appendSpansForContent::delimiterTypes[2].findNextMatch.super__Function_base._M_functor =
           (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[2].findNextMatch._M_invoker =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:672:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[2].findNextMatch.super__Function_base._M_manager =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:672:17)>
           ::_M_manager;
      appendSpansForContent::delimiterTypes[2].addReplacementElement.super__Function_base._M_functor
           = (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[2].addReplacementElement._M_invoker =
           std::
           _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:676:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[2].addReplacementElement.super__Function_base._M_manager
           = std::
             _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:676:17)>
             ::_M_manager;
      appendSpansForContent::delimiterTypes[3].findNextMatch.super__Function_base._M_functor =
           (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[3].findNextMatch._M_invoker =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:683:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[3].findNextMatch.super__Function_base._M_manager =
           std::
           _Function_handler<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:683:17)>
           ::_M_manager;
      appendSpansForContent::delimiterTypes[3].addReplacementElement.super__Function_base._M_functor
           = (_Any_data)ZEXT816(0);
      appendSpansForContent::delimiterTypes[3].addReplacementElement._M_invoker =
           std::
           _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:702:17)>
           ::_M_invoke;
      appendSpansForContent::delimiterTypes[3].addReplacementElement.super__Function_base._M_manager
           = std::
             _Function_handler<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/documentation/soul_HTMLGeneration.cpp:702:17)>
             ::_M_manager;
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)
                           ::delimiterTypes);
    }
  }
  found.items = (FoundDelimiter *)found.space;
  found.numActive = 0;
  found.numAllocated = 4;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 0x40) {
    this_00 = (function<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>)>
               *)((long)&appendSpansForContent::delimiterTypes[0].findNextMatch.super__Function_base
                         ._M_functor + lVar6);
    bVar8._M_str = markdown_local._M_str;
    bVar8._M_len = markdown_local._M_len;
    pcVar4 = markdown_local._M_str;
    std::
    function<soul::HTMLGenerator::DelimitedSection_(std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&range,this_00,bVar8);
    if (range.outerStart < range.outerEnd) {
      part2.field_2._M_allocated_capacity = range.delimiterLength;
      part2._M_dataplus._M_p = (pointer)range.outerStart;
      part2._M_string_length = range.outerEnd;
      part2.field_2._8_8_ = this_00;
      ArrayWithPreallocation<FoundDelimiter,_4UL>::push_back(&found,(FoundDelimiter *)&part2);
    }
  }
  if (found.numActive == 0) {
    if (markdown_local._M_len != 0) {
      text._M_str = markdown_local._M_str;
      text._M_len = markdown_local._M_len;
      choc::html::HTMLElement::addContent((HTMLElement *)this,text);
    }
  }
  else {
    std::
    __sort<soul::HTMLGenerator::appendSpansForContent(choc::html::HTMLElement&,std::basic_string_view<char,std::char_traits<char>>)::FoundDelimiter*,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    pFVar3 = ArrayWithPreallocation<FoundDelimiter,_4UL>::front(&found);
    __n = (pFVar3->range).outerStart;
    __pos = (pFVar3->range).outerEnd;
    sVar1 = (pFVar3->range).delimiterLength;
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&markdown_local,0,__n);
    markdown_00._M_len = bVar7._M_str;
    range._0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr
                             (&markdown_local,sVar1 + __n,__pos - (sVar1 * 2 + __n));
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&part2,(basic_string_view<char,_std::char_traits<char>_> *)&range,
               &local_121);
    bVar8 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&markdown_local,__pos,0xffffffffffffffff);
    markdown_01._M_len = bVar8._M_str;
    markdown_00._M_str = pcVar4;
    appendSpansForContent(this,(HTMLElement *)bVar7._M_len,markdown_00);
    pFVar3 = ArrayWithPreallocation<FoundDelimiter,_4UL>::front(&found);
    bVar7._M_str = part2._M_dataplus._M_p;
    bVar7._M_len = part2._M_string_length;
    _Var5 = part2._M_dataplus;
    std::
    function<void_(choc::html::HTMLElement_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&pFVar3->type->addReplacementElement,(HTMLElement *)this,bVar7);
    markdown_01._M_str = _Var5._M_p;
    appendSpansForContent(this,(HTMLElement *)bVar8._M_len,markdown_01);
    std::__cxx11::string::~string((string *)&part2);
  }
  ArrayWithPreallocation<FoundDelimiter,_4UL>::clear(&found);
  return;
}

Assistant:

static void appendSpansForContent (choc::html::HTMLElement& parent, std::string_view markdown)
    {
        static const DelimiterType delimiterTypes[] =
        {
            {
                // `code`
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "`");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addChild ("code").addContent (text);
                }
            },
            {
                // _Emphasis_
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "_");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("em").setInline (true), text);
                }
            },
            {
                // **Bold**
                [] (std::string_view text) -> DelimitedSection
                {
                    return findDelimitedSection (text, "**");
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    appendSpansForContent (parentElement.addChild ("strong").setInline (true), text);
                }
            },
            {
                // Links..
                [] (std::string_view text) -> DelimitedSection
                {
                    for (auto* proto : { "http:", "https:", "file:" })
                    {
                        auto start = text.find (proto);

                        if (start != std::string::npos)
                        {
                            auto end = text.find (' ', start);

                            if (end == std::string_view::npos) end = text.find ('\n', start);
                            if (end == std::string_view::npos) end = text.length();

                            return { start, end, 0 };
                        }
                    }

                    return {};
                },
                [] (choc::html::HTMLElement& parentElement, std::string_view text)
                {
                    parentElement.addLink (text).addContent (text);
                }
            }
        };

        struct FoundDelimiter
        {
            DelimitedSection range;
            const DelimiterType* type;

            bool operator< (const FoundDelimiter& other) const    { return range.outerStart < other.range.outerStart; }
        };

        ArrayWithPreallocation<FoundDelimiter, 4> found;

        for (auto& type : delimiterTypes)
        {
            auto range = type.findNextMatch (markdown);

            if (range.outerEnd > range.outerStart)
                found.push_back ({ range, &type });
        }

        if (! found.empty())
        {
            std::sort (found.begin(), found.end());
            auto range = found.front().range;

            auto part1 = markdown.substr (0, range.outerStart);
            auto part2 = std::string (markdown.substr (range.outerStart + range.delimiterLength,
                                                       range.outerEnd - range.outerStart - range.delimiterLength * 2));
            auto part3 = markdown.substr (range.outerEnd);

            appendSpansForContent (parent, part1);
            found.front().type->addReplacementElement (parent, part2);
            appendSpansForContent (parent, part3);
            return;
        }

        if (! markdown.empty())
            parent.addContent (markdown);
    }